

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

InterfaceHandle __thiscall
helics::CommonCore::registerPublication
          (CommonCore *this,LocalFederateId federateID,string_view key,string_view type,
          string_view units)

{
  string_view name;
  string_view string2;
  string_view string1;
  string_view key_00;
  string_view type_00;
  string_view units_00;
  string_view key_01;
  uint16_t uVar1;
  FederateState *pFVar2;
  unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *puVar3;
  CommonCore *in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  ActionMessage *in_RDI;
  size_t in_R8;
  ActionMessage *in_R9;
  uint uVar4;
  char *unaff_retaddr;
  undefined4 in_stack_00000008;
  LocalFederateId in_stack_0000000c;
  char *in_stack_00000010;
  ActionMessage reg;
  unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *handle;
  FederateState *fed;
  InterfaceHandle hid;
  atomic<helics::GlobalFederateId> *in_stack_fffffffffffffdd8;
  FederateState *in_stack_fffffffffffffde8;
  FederateState *this_00;
  size_t sVar5;
  action_t in_stack_fffffffffffffdfc;
  undefined8 in_stack_fffffffffffffe10;
  InterfaceType HandleType;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 uVar6;
  size_t in_stack_fffffffffffffe20;
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this_01;
  char *in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  size_t in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  size_t in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  uint16_t in_stack_fffffffffffffe60;
  undefined4 local_188;
  undefined4 local_184;
  undefined2 local_176;
  uint16_t in_stack_fffffffffffffed4;
  InterfaceType in_stack_fffffffffffffed7;
  FederateState *in_stack_fffffffffffffed8;
  string_view in_stack_fffffffffffffee0;
  InterfaceHandle in_stack_fffffffffffffef4;
  string_view in_stack_ffffffffffffff00;
  string_view in_stack_ffffffffffffff10;
  undefined4 in_stack_fffffffffffffffc;
  uint uVar7;
  
  HandleType = (InterfaceType)((ulong)in_stack_fffffffffffffe10 >> 0x38);
  uVar6 = 0x70;
  key_01._M_len._4_4_ = in_stack_fffffffffffffffc;
  key_01._M_len._0_4_ = in_ESI;
  key_01._M_str = unaff_retaddr;
  pFVar2 = checkNewInterface(in_RCX,in_stack_0000000c,key_01,(InterfaceType)((ulong)in_RDX >> 0x38))
  ;
  std::atomic::operator_cast_to_GlobalFederateId(in_stack_fffffffffffffdd8);
  this_00 = (FederateState *)CONCAT44(in_stack_0000000c.fid,in_stack_00000008);
  uVar1 = FederateState::getInterfaceFlags(in_stack_fffffffffffffde8);
  uVar4 = (uint)uVar1;
  key_00._M_str = in_stack_fffffffffffffe28;
  key_00._M_len = in_stack_fffffffffffffe20;
  type_00._M_str = in_stack_fffffffffffffe48;
  type_00._M_len = in_stack_fffffffffffffe40;
  units_00._M_str = in_stack_fffffffffffffe58;
  units_00._M_len = in_stack_fffffffffffffe50;
  puVar3 = createBasicHandle((CommonCore *)CONCAT44(uVar6,in_stack_fffffffffffffe18),
                             (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                             (LocalFederateId)(BaseType)in_stack_fffffffffffffe30,HandleType,key_00,
                             type_00,units_00,in_stack_fffffffffffffe60);
  uVar7 = *(uint *)((long)&(puVar3->_M_t).
                           super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                           .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl + 4);
  sVar5 = CONCAT44(in_stack_0000000c.fid,in_stack_00000008);
  FederateState::getInterfaceFlags(this_00);
  FederateState::createInterface
            (in_stack_fffffffffffffed8,in_stack_fffffffffffffed7,in_stack_fffffffffffffef4,
             in_stack_fffffffffffffee0,in_stack_ffffffffffffff00,in_stack_ffffffffffffff10,
             in_stack_fffffffffffffed4);
  this_01 = (BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *)
            &stack0xfffffffffffffe70;
  ActionMessage::ActionMessage(in_RDI,in_stack_fffffffffffffdfc);
  local_184 = uVar7;
  local_188 = std::atomic<helics::GlobalFederateId>::load(&pFVar2->global_id,seq_cst);
  name._M_str = (char *)in_R9;
  name._M_len = in_R8;
  uVar7 = local_184;
  ActionMessage::name((ActionMessage *)0x5510cc,name);
  local_176 = *(undefined2 *)
               ((long)&puVar3[1]._M_t.
                       super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                       .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl + 6);
  string1._M_len._4_4_ = in_stack_fffffffffffffdfc;
  string1._M_len._0_4_ = uVar4;
  string1._M_str = (char *)in_RDI;
  string2._M_str = in_stack_00000010;
  string2._M_len = sVar5;
  ActionMessage::setStringData(in_R9,string1,string2);
  gmlc::containers::
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  push<helics::ActionMessage>(this_01,(ActionMessage *)CONCAT44(uVar6,in_stack_fffffffffffffe18));
  ActionMessage::~ActionMessage(in_R9);
  return (InterfaceHandle)uVar7;
}

Assistant:

InterfaceHandle CommonCore::registerPublication(LocalFederateId federateID,
                                                std::string_view key,
                                                std::string_view type,
                                                std::string_view units)
{
    auto* fed = checkNewInterface(federateID, key, InterfaceType::PUBLICATION);
    const auto& handle = createBasicHandle(fed->global_id,
                                           fed->local_id,
                                           InterfaceType::PUBLICATION,
                                           key,
                                           type,
                                           units,
                                           fed->getInterfaceFlags());

    auto hid = handle.handle.handle;
    fed->createInterface(
        InterfaceType::PUBLICATION, hid, key, type, units, fed->getInterfaceFlags());

    ActionMessage reg(CMD_REG_PUB);
    reg.source_id = fed->global_id.load();
    reg.source_handle = hid;
    reg.name(key);
    reg.flags = handle.flags;
    reg.setStringData(type, units);

    actionQueue.push(std::move(reg));
    return hid;
}